

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall
LastVal<BoolView,_bool>::LastVal(LastVal<BoolView,_bool> *this,BoolView *_x,bool *_v)

{
  undefined8 in_RDX;
  _func_int **in_RSI;
  Propagator *in_RDI;
  Propagator *in_stack_ffffffffffffffd8;
  BoolView *in_stack_ffffffffffffffe0;
  
  Propagator::Propagator(in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__LastVal_0031eee0;
  in_RDI[1]._vptr_Propagator = in_RSI;
  in_RDI[1].prop_id = (int)in_RDX;
  in_RDI[1].priority = (int)((ulong)in_RDX >> 0x20);
  in_RDI->priority = 0;
  BoolView::attach(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI);
  return;
}

Assistant:

LastVal(Var* _x, Val* _v) : x(_x), v(_v) {
		priority = 0;
		x->attach(this, 0, EVENT_F);
	}